

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Vec_Str_t *
Abc_NtkClpGiaOne2(Cnf_Dat_t *pCnf,Gia_Man_t *p,int iCo,int nCubeLim,int nBTLimit,int fCanon,
                 int fReverse,Vec_Int_t *vSupp,Vec_Int_t *vMap,int fVerbose,Vec_Int_t *vClass,
                 Vec_Wec_t *vSupps)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes;
  Vec_Int_t *vSupp_00;
  sat_solver *pSat;
  Vec_Str_t *vSop;
  abctime aVar3;
  abctime time;
  int i;
  int iCoObjId;
  int local_4c;
  int local_48;
  int local_44;
  abctime local_40;
  Cnf_Dat_t *local_38;
  
  local_4c = nCubeLim;
  local_48 = nBTLimit;
  local_44 = fCanon;
  local_38 = pCnf;
  local_40 = Abc_Clock();
  pGVar2 = Gia_ManCo(p,iCo);
  iCoObjId = Gia_ObjId(p,pGVar2);
  vNodes = Vec_IntAlloc(100);
  vSupp_00 = Vec_IntAlloc(100);
  for (i = 0; i < vSupp->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vSupp,i);
    iVar1 = Vec_IntEntry(p->vCis,iVar1);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pGVar2);
    Vec_IntPush(vSupp_00,iVar1);
  }
  Gia_ManIncrementTravId(p);
  Gia_ManCollectAnds(p,&iCoObjId,1,vNodes,(Vec_Int_t *)0x0);
  if (0 < vNodes->nSize) {
    pSat = Abc_NtkClpDeriveSatSolver
                     (local_38,iCoObjId,vSupp_00,vNodes,vMap,(sat_solver **)0x0,(sat_solver **)0x0,
                      (sat_solver **)0x0);
    Vec_IntFree(vSupp_00);
    if (fVerbose != 0) {
      printf("Output %4d:  Supp = %4d. Cone =%6d.\n",(ulong)(uint)iCo,(ulong)(uint)vSupp->nSize,
             (ulong)(uint)vNodes->nSize);
    }
    vSop = Bmc_CollapseOne_int(pSat,vSupp->nSize,local_4c,local_48,local_44,fReverse,fVerbose);
    sat_solver_delete(pSat);
    Vec_IntFree(vNodes);
    if (vSop != (Vec_Str_t *)0x0) {
      Abc_NtkCollapseReduce(vSop,vSupp,vClass,vSupps);
      if (fVerbose != 0) {
        printf("Supp new = %4d. Sop = %4d.  ",(ulong)(uint)vSupp->nSize,
               (long)vSop->nSize / (long)(int)(vSupp->nSize + 3) & 0xffffffff);
        aVar3 = Abc_Clock();
        Abc_PrintTime(0x816bba,(char *)(aVar3 - local_40),time);
      }
    }
    return vSop;
  }
  __assert_fail("Vec_IntSize(vAnds) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                ,0x2fb,
                "Vec_Str_t *Abc_NtkClpGiaOne2(Cnf_Dat_t *, Gia_Man_t *, int, int, int, int, int, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
               );
}

Assistant:

Vec_Str_t * Abc_NtkClpGiaOne2( Cnf_Dat_t * pCnf, Gia_Man_t * p, int iCo, int nCubeLim, int nBTLimit, int fCanon, int fReverse, Vec_Int_t * vSupp, Vec_Int_t * vMap, int fVerbose, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    Vec_Str_t * vSop;
    sat_solver * pSat, * pSat1 = NULL, * pSat2 = NULL, * pSat3 = NULL;
    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    extern Vec_Str_t * Bmc_CollapseOne_int( sat_solver * pSat, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    extern Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    extern Vec_Str_t * Bmc_CollapseOne_int3( sat_solver * pSat, sat_solver * pSat1, sat_solver * pSat2, sat_solver * pSat3, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    int i, iCoObjId = Gia_ObjId( p, Gia_ManCo(p, iCo) );
    Vec_Int_t * vAnds = Vec_IntAlloc( 100 );
    Vec_Int_t * vSuppObjs = Vec_IntAlloc( 100 );
    Gia_ManForEachCiVec( vSupp, p, pObj, i )
        Vec_IntPush( vSuppObjs, Gia_ObjId(p, pObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iCoObjId, 1, vAnds, NULL );
    assert( Vec_IntSize(vAnds) > 0 );
//    pSat = Abc_NtkClpDeriveSatSolver( pCnf, iCoObjId, vSuppObjs, vAnds, vMap, &pSat1, &pSat2, &pSat3 );
    pSat = Abc_NtkClpDeriveSatSolver( pCnf, iCoObjId, vSuppObjs, vAnds, vMap, NULL, NULL, NULL );
    Vec_IntFree( vSuppObjs );
    if ( fVerbose )
        printf( "Output %4d:  Supp = %4d. Cone =%6d.\n", iCo, Vec_IntSize(vSupp), Vec_IntSize(vAnds) );
//    vSop = Bmc_CollapseOne_int3( pSat, pSat1, pSat2, pSat3, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
//    vSop = Bmc_CollapseOne_int2( pSat, pSat1, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    vSop = Bmc_CollapseOne_int( pSat, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    sat_solver_delete( pSat );
    if ( pSat1 ) sat_solver_delete( pSat1 );
    if ( pSat2 ) sat_solver_delete( pSat2 );
    if ( pSat3 ) sat_solver_delete( pSat3 );
    Vec_IntFree( vAnds );
    if ( vSop == NULL )
        return NULL;
    Abc_NtkCollapseReduce( vSop, vSupp, vClass, vSupps );
    if ( fVerbose )
        printf( "Supp new = %4d. Sop = %4d.  ", Vec_IntSize(vSupp), Vec_StrSize(vSop)/(Vec_IntSize(vSupp) +3) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vSop; 
}